

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

Curl_addrinfo * Curl_doh(Curl_easy *data,char *hostname,int port,int ip_version,int *waitp)

{
  undefined1 *puVar1;
  connectdata *pcVar2;
  _Bool _Var3;
  CURLcode CVar4;
  char *pcVar5;
  doh_probes *pmid;
  long lVar6;
  
  pcVar2 = data->conn;
  if ((data->state).async.doh != (doh_probes *)0x0) {
    Curl_doh_cleanup(data);
  }
  puVar1 = &(data->state).async.field_0x28;
  *puVar1 = *puVar1 & 0xfe;
  (data->state).async.port = port;
  (data->state).async.ip_version = ip_version;
  pcVar5 = (*Curl_cstrdup)(hostname);
  (data->state).async.hostname = pcVar5;
  if (pcVar5 == (char *)0x0) {
    return (Curl_addrinfo *)0x0;
  }
  pmid = (doh_probes *)(*Curl_ccalloc)(1,0x70);
  (data->state).async.doh = pmid;
  if (pmid == (doh_probes *)0x0) {
    return (Curl_addrinfo *)0x0;
  }
  for (lVar6 = 0; lVar6 != 0x60; lVar6 = lVar6 + 0x30) {
    *(undefined4 *)((long)&pmid->probe_resp[0].probe_mid + lVar6) = 0xffffffff;
    Curl_dyn_init((dynbuf *)((long)&pmid->probe_resp[0].body.bufr + lVar6),3000);
  }
  puVar1 = &(pcVar2->bits).field_0x3;
  *puVar1 = *puVar1 | 2;
  pmid->host = (data->state).async.hostname;
  pmid->port = (data->state).async.port;
  data->sub_xfer_done = doh_probe_done;
  CVar4 = doh_probe_run(data,DNS_TYPE_A,hostname,(data->set).str[0x3f],data->multi,(uint *)pmid);
  if (CVar4 == CURLE_OK) {
    pmid->pending = pmid->pending + 1;
    if ((ip_version != 1) && (_Var3 = Curl_ipv6works(data), _Var3)) {
      CVar4 = doh_probe_run(data,DNS_TYPE_AAAA,hostname,(data->set).str[0x3f],data->multi,
                            &pmid->probe_resp[1].probe_mid);
      if (CVar4 != CURLE_OK) goto LAB_001231f1;
      pmid->pending = pmid->pending + 1;
    }
    *waitp = 1;
  }
  else {
LAB_001231f1:
    Curl_doh_cleanup(data);
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *Curl_doh(struct Curl_easy *data,
                               const char *hostname,
                               int port,
                               int ip_version,
                               int *waitp)
{
  CURLcode result = CURLE_OK;
  struct doh_probes *dohp = NULL;
  struct connectdata *conn = data->conn;
  size_t i;

  DEBUGASSERT(conn);
  DEBUGASSERT(!data->state.async.doh);
  if(data->state.async.doh)
    Curl_doh_cleanup(data);

  data->state.async.done = FALSE;
  data->state.async.port = port;
  data->state.async.ip_version = ip_version;
  data->state.async.hostname = strdup(hostname);
  if(!data->state.async.hostname)
    return NULL;

  /* start clean, consider allocating this struct on demand */
  data->state.async.doh = dohp = calloc(1, sizeof(struct doh_probes));
  if(!dohp)
    return NULL;

  for(i = 0; i < DOH_SLOT_COUNT; ++i) {
    dohp->probe_resp[i].probe_mid = UINT_MAX;
    Curl_dyn_init(&dohp->probe_resp[i].body, DYN_DOH_RESPONSE);
  }

  conn->bits.doh = TRUE;
  dohp->host = data->state.async.hostname;
  dohp->port = data->state.async.port;
  /* We are making sub easy handles and want to be called back when
   * one is done. */
  data->sub_xfer_done = doh_probe_done;

  /* create IPv4 DoH request */
  result = doh_probe_run(data, DNS_TYPE_A,
                         hostname, data->set.str[STRING_DOH],
                         data->multi,
                         &dohp->probe_resp[DOH_SLOT_IPV4].probe_mid);
  if(result)
    goto error;
  dohp->pending++;

#ifdef USE_IPV6
  if((ip_version != CURL_IPRESOLVE_V4) && Curl_ipv6works(data)) {
    /* create IPv6 DoH request */
    result = doh_probe_run(data, DNS_TYPE_AAAA,
                           hostname, data->set.str[STRING_DOH],
                           data->multi,
                           &dohp->probe_resp[DOH_SLOT_IPV6].probe_mid);
    if(result)
      goto error;
    dohp->pending++;
  }
#endif

#ifdef USE_HTTPSRR
  if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
    /* Only use HTTPS RR for HTTP(S) transfers */
    char *qname = NULL;
    if(port != PORT_HTTPS) {
      qname = aprintf("_%d._https.%s", port, hostname);
      if(!qname)
        goto error;
    }
    result = doh_probe_run(data, DNS_TYPE_HTTPS,
                           qname ? qname : hostname, data->set.str[STRING_DOH],
                           data->multi,
                           &dohp->probe_resp[DOH_SLOT_HTTPS_RR].probe_mid);
    free(qname);
    if(result)
      goto error;
    dohp->pending++;
  }
#endif
  *waitp = TRUE; /* this never returns synchronously */
  return NULL;

error:
  Curl_doh_cleanup(data);
  return NULL;
}